

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

uint32_t FAudioFXReverb_LockForProcess
                   (FAudioFXReverb *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  ushort uVar1;
  FAudioWaveFormatEx *pFVar2;
  FAudioMallocFunc pMalloc;
  ushort uVar3;
  int8_t iVar4;
  uint uVar5;
  uint32_t uVar6;
  ushort uVar7;
  FAudioWaveFormatEx *pFVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  DspDelay *filter;
  FAudioFXReverb *pFVar12;
  DspDelay *pDVar13;
  float fVar14;
  float in_XMM2_Da;
  DspDelay *local_58;
  
  iVar4 = IsFloatFormat(pInputLockedParameters->pFormat);
  if ((iVar4 != '\0') &&
     (pFVar2 = pInputLockedParameters->pFormat, 0xffff929e < pFVar2->nSamplesPerSec - 0xbb81)) {
    uVar1 = pFVar2->nChannels;
    if (uVar1 == 6) {
      pFVar8 = pOutputLockedParameters->pFormat;
      uVar7 = 6;
      uVar3 = pFVar8->nChannels;
    }
    else if (uVar1 == 2) {
      pFVar8 = pOutputLockedParameters->pFormat;
      uVar7 = pFVar8->nChannels;
      uVar3 = uVar7 | 4;
    }
    else {
      if (uVar1 != 1) {
        return 0x88970001;
      }
      pFVar8 = pOutputLockedParameters->pFormat;
      uVar7 = pFVar8->nChannels;
      uVar3 = uVar7;
      if (uVar7 == 1) goto LAB_00114d38;
    }
    if (uVar3 == 6) {
LAB_00114d38:
      fapo->inChannels = uVar1;
      fapo->outChannels = uVar7;
      uVar6 = pFVar8->nSamplesPerSec;
      fapo->sampleRate = uVar6;
      fapo->inBlockAlign = pFVar2->nBlockAlign;
      fapo->outBlockAlign = pFVar8->nBlockAlign;
      pMalloc = (fapo->base).pMalloc;
      SDL_memset(&fapo->reverb,0,0x17e0);
      DspDelay_Initialize(&(fapo->reverb).early_delay,uVar6,10.0,pMalloc);
      DspDelay_Initialize(&(fapo->reverb).apf_in[0].delay,uVar6,13.28,pMalloc);
      (fapo->reverb).apf_in[0].feedback_gain = 0.5;
      uVar5 = uVar1 == 6 | 4;
      if (uVar7 != 6) {
        uVar5 = (uint)uVar7;
      }
      (fapo->reverb).reverb_channels = uVar5;
      local_58 = &(fapo->reverb).channel[0].apf_out[0].delay;
      pFVar12 = fapo;
      for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
        filter = &(fapo->reverb).channel[lVar10].reverb_delay;
        DspDelay_Initialize(filter,uVar6,10.0,pMalloc);
        pfVar11 = COMB_DELAYS;
        for (lVar9 = 0; lVar9 != 0x3c0; lVar9 = lVar9 + 0x78) {
          pDVar13 = (DspDelay *)
                    ((long)&(pFVar12->reverb).channel[0].lpf_comb[0].comb_delay.sampleRate + lVar9);
          fVar14 = FAudio_GetStereoSpreadDelayMS((fapo->reverb).reverb_channels,(int32_t)lVar10);
          DspDelay_Initialize(pDVar13,uVar6,fVar14 + *pfVar11,pMalloc);
          fVar14 = DspComb_FeedbackFromRT60(pDVar13,500.0);
          *(float *)((long)&(pFVar12->reverb).channel[0].lpf_comb[0].comb_feedback_gain + lVar9) =
               fVar14;
          DspBiQuad_Initialize
                    ((DspBiQuad *)
                     ((long)&(pFVar12->reverb).channel[0].lpf_comb[0].low_shelving.sampleRate +
                     lVar9),uVar6,DSP_BIQUAD_LOWSHELVING,500.0,-6.0,in_XMM2_Da);
          DspBiQuad_Initialize
                    ((DspBiQuad *)
                     ((long)&(pFVar12->reverb).channel[0].lpf_comb[0].high_shelving.sampleRate +
                     lVar9),uVar6,DSP_BIQUAD_HIGHSHELVING,5000.0,-6.0,in_XMM2_Da);
          pfVar11 = pfVar11 + 1;
        }
        pDVar13 = local_58;
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
          fVar14 = FAudio_GetStereoSpreadDelayMS((fapo->reverb).reverb_channels,(int32_t)lVar10);
          DspDelay_Initialize(pDVar13,uVar6,fVar14 + *(float *)((long)APF_OUT_DELAYS + lVar9),
                              pMalloc);
          pDVar13[1].sampleRate = 0x3f000000;
          pDVar13 = (DspDelay *)&pDVar13[1].delay;
        }
        DspBiQuad_Initialize
                  ((DspBiQuad *)(filter + 0x24),uVar6,DSP_BIQUAD_HIGHSHELVING,5000.0,-10.0,
                   in_XMM2_Da);
        filter[0x25].read_idx = 0x3f800000;
        uVar5 = (fapo->reverb).reverb_channels;
        pFVar12 = (FAudioFXReverb *)((pFVar12->reverb).channel[0].lpf_comb + 7);
        local_58 = (DspDelay *)&local_58[0x25].write_idx;
      }
      (fapo->reverb).early_gain = 1.0;
      (fapo->reverb).reverb_gain = 1.0;
      (fapo->reverb).wet_ratio = 1.0;
      (fapo->reverb).dry_ratio = 0.0;
      (fapo->reverb).in_channels = (uint)uVar1;
      (fapo->reverb).out_channels = (uint)uVar7;
      uVar6 = FAPOBase_LockForProcess
                        (&fapo->base,InputLockedParameterCount,pInputLockedParameters,
                         OutputLockedParameterCount,pOutputLockedParameters);
      return uVar6;
    }
  }
  return 0x88970001;
}

Assistant:

uint32_t FAudioFXReverb_LockForProcess(
	FAudioFXReverb *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Reverb specific validation */
	if (!IsFloatFormat(pInputLockedParameters->pFormat))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (	pInputLockedParameters->pFormat->nSamplesPerSec < FAUDIOFX_REVERB_MIN_FRAMERATE ||
		pInputLockedParameters->pFormat->nSamplesPerSec > FAUDIOFX_REVERB_MAX_FRAMERATE	)
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (!(	(pInputLockedParameters->pFormat->nChannels == 1 &&
			(pOutputLockedParameters->pFormat->nChannels == 1 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 2 &&
			(pOutputLockedParameters->pFormat->nChannels == 2 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 6 &&
			pOutputLockedParameters->pFormat->nChannels == 6)))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	/* Save the things we care about */
	fapo->inChannels = pInputLockedParameters->pFormat->nChannels;
	fapo->outChannels = pOutputLockedParameters->pFormat->nChannels;
	fapo->sampleRate = pOutputLockedParameters->pFormat->nSamplesPerSec;
	fapo->inBlockAlign = pInputLockedParameters->pFormat->nBlockAlign;
	fapo->outBlockAlign = pOutputLockedParameters->pFormat->nBlockAlign;

	/* Create the network */
	DspReverb_Create(
		&fapo->reverb,
		fapo->sampleRate,
		fapo->inChannels,
		fapo->outChannels,
		fapo->base.pMalloc
	);

	/* Call	parent to do basic validation */
	return FAPOBase_LockForProcess(
		&fapo->base,
		InputLockedParameterCount,
		pInputLockedParameters,
		OutputLockedParameterCount,
		pOutputLockedParameters
	);
}